

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O1

void __thiscall FUnzip::smartDestDir(FUnzip *this,ZipStream *zs)

{
  string *__return_storage_ptr__;
  pointer pEVar1;
  bool bVar2;
  long lVar3;
  Entry *e;
  pointer pEVar4;
  undefined1 local_70 [8];
  string first;
  string n;
  
  if ((long)(zs->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(zs->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
            _M_impl.super__Vector_impl_data._M_start != 0x38) {
    __return_storage_ptr__ = (string *)(&first.field_2._M_allocated_capacity + 1);
    path_basename(__return_storage_ptr__,&this->zipName);
    std::__cxx11::string::operator=
              ((string *)&this->destinationDir,(string *)__return_storage_ptr__);
    if ((size_type *)first.field_2._8_8_ != &n._M_string_length) {
      operator_delete((void *)first.field_2._8_8_,n._M_string_length + 1);
    }
    pEVar4 = (zs->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&(pEVar4->name)._M_dataplus;
    first.field_2._8_8_ = &n._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar3,(pEVar4->name)._M_string_length + lVar3);
    lVar3 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2f);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_70,(ulong)((long)&first.field_2 + 8));
      pEVar4 = (zs->entries_).
               super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar1 = (zs->entries_).
               super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pEVar4 != pEVar1) {
        do {
          bVar2 = startsWith(&pEVar4->name,(string *)local_70);
          if (!bVar2) goto LAB_0011ff6b;
          pEVar4 = pEVar4 + 1;
        } while (pEVar4 != pEVar1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&this->destinationDir,0,(char *)(this->destinationDir)._M_string_length,
                 0x13c54e);
LAB_0011ff6b:
      if (local_70 != (undefined1  [8])&first._M_string_length) {
        operator_delete((void *)local_70,first._M_string_length + 1);
      }
    }
    if ((size_type *)first.field_2._8_8_ != &n._M_string_length) {
      operator_delete((void *)first.field_2._8_8_,n._M_string_length + 1);
    }
  }
  return;
}

Assistant:

void FUnzip::smartDestDir(ZipStream& zs)
{
    if (zs.size() == 1)
        return;

    destinationDir = path_basename(zipName);

    auto n = zs.getEntry(0).name;

    auto pos = n.find('/');
    if (pos == std::string::npos)
        return;
    std::string first = n.substr(0, pos);

    for (const auto& e : zs) {
        if (!startsWith(e.name, first))
            return;
    }
    destinationDir = "";
}